

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O0

void __thiscall
DbaseCtrlBlk::get_next_trans(DbaseCtrlBlk *this,int **lbuf,int *nitems,int *tid,int *cid)

{
  unsigned_long uVar1;
  int *cid_local;
  int *tid_local;
  int *nitems_local;
  int **lbuf_local;
  DbaseCtrlBlk *this_local;
  
  if ((this->cur_blk_size <= (ulong)(long)(this->cur_buf_pos + 3)) ||
     (this->cur_blk_size < (ulong)(long)(this->cur_buf_pos + this->buf[this->cur_buf_pos + 2] + 3)))
  {
    uVar1 = lseek(this->fd,0,1);
    if (uVar1 == this->endpos) {
      this->readall = '\x01';
    }
    if (this->readall == '\0') {
      get_next_trans_ext(this);
    }
  }
  if (this->readall == '\0') {
    *cid = this->buf[this->cur_buf_pos];
    *tid = this->buf[this->cur_buf_pos + 1];
    *nitems = this->buf[this->cur_buf_pos + 2];
    *lbuf = this->buf + (long)this->cur_buf_pos + 3;
    this->cur_buf_pos = *nitems + 3 + this->cur_buf_pos;
  }
  return;
}

Assistant:

void DbaseCtrlBlk::get_next_trans(int *&lbuf, int &nitems, int &tid, int &cid) {
    if (cur_buf_pos + TRANSOFF >= cur_blk_size ||
        cur_buf_pos + buf[cur_buf_pos + TRANSOFF - 1] + TRANSOFF > cur_blk_size) {
        if (lseek(fd, 0, SEEK_CUR) == endpos) readall = 1;
        if (!readall) {
            // Need to get more items from file
            get_next_trans_ext();
        }
    }

    if (!readall) {
        cid = buf[cur_buf_pos];
        tid = buf[cur_buf_pos + TRANSOFF - 2];
        nitems = buf[cur_buf_pos + TRANSOFF - 1];
        lbuf = buf + cur_buf_pos + TRANSOFF;
        cur_buf_pos += nitems + TRANSOFF;
    }
}